

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::f_formatter<spdlog::details::scoped_padder>::format
          (f_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  scoped_padder *in_RDI;
  scoped_padder p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1000000L>_> micros;
  memory_buf_t *in_stack_ffffffffffffff78;
  memory_buf_t *in_stack_ffffffffffffff88;
  padding_info *in_stack_ffffffffffffff90;
  time_point in_stack_ffffffffffffff98;
  scoped_padder *in_stack_ffffffffffffffa0;
  duration<long,_std::ratio<1L,_1000000L>_> local_28 [5];
  
  local_28[0] = fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000000l>>>
                          (in_stack_ffffffffffffff98);
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98.__d.__r,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(local_28);
  fmt_helper::pad6<unsigned_long>((unsigned_long)in_RDI,in_stack_ffffffffffffff78);
  scoped_padder::~scoped_padder(in_RDI);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto micros = fmt_helper::time_fraction<std::chrono::microseconds>(msg.time);

        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad6(static_cast<size_t>(micros.count()), dest);
    }